

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl> *this_local;
  
  if (pointer != (void *)0x0) {
    anon_unknown_30::AsyncIoProviderImpl::~AsyncIoProviderImpl((AsyncIoProviderImpl *)pointer);
    operator_delete(pointer,0x78);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }